

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamPop(xmlStreamCtxtPtr stream)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  if (stream == (xmlStreamCtxtPtr)0x0) {
    return -1;
  }
  do {
    iVar1 = stream->level;
    if (stream->blockLevel == iVar1) {
      stream->blockLevel = -1;
    }
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + -1;
      stream->level = iVar1;
    }
    iVar3 = stream->nbState;
    if (0 < (long)iVar3) {
      uVar2 = (long)iVar3 + 1;
      do {
        iVar3 = iVar3 + -1;
        if (stream->states[uVar2 * 2 + -3] <= iVar1) break;
        stream->nbState = iVar3;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    stream = stream->next;
    if (stream == (_xmlStreamCtxt *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
xmlStreamPop(xmlStreamCtxtPtr stream) {
    int i, lev;

    if (stream == NULL)
        return(-1);
    while (stream != NULL) {
	/*
	* Reset block-level.
	*/
	if (stream->blockLevel == stream->level)
	    stream->blockLevel = -1;

	/*
	 *  stream->level can be zero when XML_FINAL_IS_ANY_NODE is set
	 *  (see the thread at
	 *  http://mail.gnome.org/archives/xslt/2008-July/msg00027.html)
	 */
	if (stream->level)
	    stream->level--;
	/*
	 * Check evolution of existing states
	 */
	for (i = stream->nbState -1; i >= 0; i--) {
	    /* discard obsoleted states */
	    lev = stream->states[(2 * i) + 1];
	    if (lev > stream->level)
		stream->nbState--;
	    if (lev <= stream->level)
		break;
	}
	stream = stream->next;
    }
    return(0);
}